

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O3

void __thiscall kratos::EnableStmtVisitor::visit(EnableStmtVisitor *this,ScopedStmtBlock *stmt)

{
  pointer psVar1;
  pointer psVar2;
  pointer psVar3;
  Stmt *stmt_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar4;
  Generator *pGVar5;
  ulong uVar6;
  ulong uVar7;
  long *local_80 [2];
  long local_70 [2];
  undefined1 local_60 [8];
  shared_ptr<kratos::Var> cond;
  
  psVar1 = (stmt->super_StmtBlock).stmts_.
           super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  psVar2 = (stmt->super_StmtBlock).stmts_.
           super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pGVar5 = Stmt::generator_parent((Stmt *)stmt);
  if (psVar1 != psVar2) {
    uVar6 = 0;
    uVar7 = 1;
    do {
      psVar3 = (stmt->super_StmtBlock).stmts_.
               super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      stmt_00 = psVar3[uVar6].super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      this_00 = psVar3[uVar6].super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
      }
      get_cond((EnableStmtVisitor *)local_60,stmt_00);
      if (local_60 != (undefined1  [8])0x0) {
        cond.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)stmt_00;
        (**(code **)(*(_func_int **)local_60 + 0x110))(local_80,local_60,pGVar5);
        std::
        _Hashtable<kratos::Stmt_const*,std::pair<kratos::Stmt_const*const,std::__cxx11::string>,std::allocator<std::pair<kratos::Stmt_const*const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<kratos::Stmt_const*>,std::hash<kratos::Stmt_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
        ::_M_emplace<kratos::Stmt*,std::__cxx11::string>
                  ((_Hashtable<kratos::Stmt_const*,std::pair<kratos::Stmt_const*const,std::__cxx11::string>,std::allocator<std::pair<kratos::Stmt_const*const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<kratos::Stmt_const*>,std::hash<kratos::Stmt_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                    *)&this->values,
                   &cond.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                   local_80);
        if (local_80[0] != local_70) {
          operator_delete(local_80[0],local_70[0] + 1);
        }
      }
      if (cond.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   cond.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      }
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      bVar4 = uVar7 < (ulong)((long)psVar1 - (long)psVar2 >> 4);
      uVar6 = uVar7;
      uVar7 = (ulong)((int)uVar7 + 1);
    } while (bVar4);
  }
  return;
}

Assistant:

void visit(ScopedStmtBlock* stmt) override {
        auto count = stmt->size();
        auto* gen = stmt->generator_parent();
        for (auto i = 0u; i < count; i++) {
            auto const& s = stmt->get_stmt(i);
            auto cond = get_cond(s.get());
            if (cond) {
                values.emplace(s.get(), cond->handle_name(gen));
            }
        }
    }